

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_write_uvector(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  byte bVar1;
  char cVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  undefined1 x [16];
  undefined1 x_00 [16];
  sexp psVar6;
  ulong uVar7;
  sexp psVar8;
  sexp extraout_RDX;
  sexp extraout_RDX_00;
  sexp psVar9;
  undefined1 *extraout_RDX_01;
  undefined1 *extraout_RDX_02;
  undefined1 *extraout_RDX_03;
  undefined1 *extraout_RDX_04;
  undefined1 *extraout_RDX_05;
  sexp extraout_RDX_06;
  sexp extraout_RDX_07;
  undefined1 *extraout_RDX_08;
  undefined1 *extraout_RDX_09;
  undefined1 *extraout_RDX_10;
  undefined1 *n_00;
  sexp extraout_RDX_11;
  sexp extraout_RDX_12;
  sexp extraout_RDX_13;
  sexp extraout_RDX_14;
  undefined1 *extraout_RDX_15;
  undefined1 *extraout_RDX_16;
  long lVar10;
  sexp psVar11;
  double dVar12;
  sexp f;
  sexp tmp;
  sexp psVar13;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = (sexp_conflict *)&stack0xffffffffffffff98;
  local_40.var = (sexp_conflict *)&stack0xffffffffffffffa0;
  psVar13 = (sexp)&DAT_0000043e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar6 = sexp_make_flonum(ctx,0.0);
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x23,(FILE *)(out->value).type.getters);
  }
  else {
    psVar9 = (out->value).type.print;
    if (psVar9 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar9->tag + 1);
      *(undefined1 *)((long)&psVar9->tag + (long)&psVar3->tag) = 0x23;
    }
    else {
      sexp_buffered_write_char(ctx,0x23,out);
    }
  }
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc((uint)"#ususususuffccff"[(obj->value).uvector.element_type],
         (FILE *)(out->value).type.getters);
    psVar9 = extraout_RDX;
  }
  else {
    psVar9 = (out->value).type.print;
    bVar1 = "#ususususuffccff"[(obj->value).uvector.element_type];
    if (psVar9 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar9->tag + 1);
      *(byte *)((long)&psVar9->tag + (long)&psVar3->tag) = bVar1;
    }
    else {
      sexp_buffered_write_char(ctx,(uint)bVar1,out);
      psVar9 = extraout_RDX_00;
    }
  }
  sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar9,
                (sexp)((ulong)""[(obj->value).uvector.element_type] * 2 + 1),out);
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x28,(FILE *)(out->value).type.getters);
    n_00 = extraout_RDX_01;
  }
  else {
    psVar9 = (out->value).type.print;
    if (psVar9 < (sexp)(out->value).port.size) {
      n_00 = (undefined1 *)((long)&psVar9->tag + 1);
      (out->value).port.offset = (sexp_uint_t)n_00;
      *(undefined1 *)((long)&psVar9->tag + (long)&psVar3->tag) = 0x28;
    }
    else {
      sexp_buffered_write_char(ctx,0x28,out);
      n_00 = extraout_RDX_02;
    }
  }
  psVar3 = (obj->value).type.slots;
  if (psVar3 != (sexp)0x0) {
    psVar9 = (obj->value).type.name;
    lVar10 = 0;
    psVar11 = (sexp)0x0;
    do {
      if (psVar11 != (sexp)0x0) {
        psVar8 = (out->value).type.setters;
        if (psVar8 == (sexp)0x0) {
          putc(0x20,(FILE *)(out->value).type.getters);
          n_00 = extraout_RDX_03;
        }
        else {
          uVar7 = (out->value).port.offset;
          if (uVar7 < (out->value).port.size) {
            n_00 = (undefined1 *)(uVar7 + 1);
            (out->value).port.offset = (sexp_uint_t)n_00;
            *(undefined1 *)((long)&psVar8->tag + uVar7) = 0x20;
          }
          else {
            sexp_buffered_write_char(ctx,0x20,out);
            n_00 = extraout_RDX_04;
          }
        }
      }
      psVar8 = psVar6;
      switch((obj->value).flonum_bits[8]) {
      case '\x01':
        psVar8 = (sexp)(ulong)(((uint)(int)(((obj->value).type.name)->value).flonum_bits
                                           [((ulong)psVar11 >> 3) + 8] >> ((byte)psVar11 & 7) & 1) *
                               2 + 1);
        goto LAB_0010dda3;
      case '\x02':
        uVar7 = (ulong)((psVar9->value).flonum_bits + 8)[(long)psVar11];
        goto LAB_0010dd2c;
      default:
        goto switchD_0010dbe2_caseD_3;
      case '\x04':
        uVar7 = (ulong)*(short *)((long)&psVar9->value + (long)psVar11 * 2 + 8);
        goto LAB_0010dd2c;
      case '\x05':
        uVar7 = (ulong)*(ushort *)((long)&psVar9->value + (long)psVar11 * 2 + 8);
LAB_0010dd2c:
        psVar8 = (sexp)(uVar7 * 2 + 1);
        goto LAB_0010dda3;
      case '\x06':
        goto LAB_0010dd42;
      case '\a':
        goto LAB_0010dd51;
      case '\b':
LAB_0010dd42:
        x._8_8_ = psVar13;
        x._0_8_ = psVar6;
        psVar8 = sexp_make_integer(ctx,(sexp_lsint_t)x);
        n_00 = extraout_RDX_08;
        psVar13 = psVar8;
        goto LAB_0010dda3;
      case '\t':
LAB_0010dd51:
        x_00._8_8_ = psVar13;
        x_00._0_8_ = psVar6;
        psVar8 = sexp_make_unsigned_integer(ctx,(sexp_luint_t)x_00);
        n_00 = extraout_RDX_09;
        psVar13 = psVar8;
        goto LAB_0010dda3;
      case '\n':
        dVar12 = (double)*(float *)((long)&psVar9->value + (long)psVar11 * 4 + 8);
        break;
      case '\v':
        dVar12 = *(double *)((long)&psVar9->value + (long)psVar11 * 8 + 8);
        break;
      case '\f':
        (psVar6->value).flonum = (double)*(float *)((long)&psVar9->value + (long)psVar11 * 8 + 8);
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar6,out);
        psVar8 = extraout_RDX_06;
        if (0.0 <= *(float *)((long)&psVar9->value + (long)psVar11 * 8 + 0xc)) {
          psVar4 = (out->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(0x2b,(FILE *)(out->value).type.getters);
            psVar8 = extraout_RDX_11;
          }
          else {
            psVar5 = (out->value).type.print;
            if (psVar5 < (sexp)(out->value).port.size) {
              psVar8 = (sexp)((long)&psVar5->tag + 1);
              (out->value).type.print = psVar8;
              *(undefined1 *)((long)&psVar5->tag + (long)&psVar4->tag) = 0x2b;
            }
            else {
              sexp_buffered_write_char(ctx,0x2b,out);
              psVar8 = extraout_RDX_13;
            }
          }
        }
        dVar12 = (double)*(float *)((long)&psVar9->value + (long)psVar11 * 8 + 0xc);
        goto LAB_0010de15;
      case '\r':
        (psVar6->value).flonum = *(double *)((long)&psVar9->value + lVar10 + 8);
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar6,out);
        psVar8 = extraout_RDX_07;
        if (0.0 <= *(double *)((long)&psVar9->value + lVar10 + 0x10)) {
          psVar4 = (out->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(0x2b,(FILE *)(out->value).type.getters);
            psVar8 = extraout_RDX_12;
          }
          else {
            psVar5 = (out->value).type.print;
            if (psVar5 < (sexp)(out->value).port.size) {
              psVar8 = (sexp)((long)&psVar5->tag + 1);
              (out->value).type.print = psVar8;
              *(undefined1 *)((long)&psVar5->tag + (long)&psVar4->tag) = 0x2b;
            }
            else {
              sexp_buffered_write_char(ctx,0x2b,out);
              psVar8 = extraout_RDX_14;
            }
          }
        }
        dVar12 = *(double *)((long)&psVar9->value + lVar10 + 0x10);
LAB_0010de15:
        (psVar6->value).flonum = dVar12;
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar8,psVar6,out);
        psVar8 = (out->value).type.setters;
        if (psVar8 == (sexp)0x0) {
          putc(0x69,(FILE *)(out->value).type.getters);
          n_00 = extraout_RDX_15;
        }
        else {
          psVar4 = (out->value).type.print;
          if (psVar4 < (sexp)(out->value).port.size) {
            n_00 = (undefined1 *)((long)&psVar4->tag + 1);
            (out->value).port.offset = (sexp_uint_t)n_00;
            *(undefined1 *)((long)&psVar4->tag + (long)&psVar8->tag) = 0x69;
          }
          else {
            sexp_buffered_write_char(ctx,0x69,out);
            n_00 = extraout_RDX_16;
          }
        }
        goto switchD_0010dbe2_caseD_3;
      case '\x0e':
        cVar2 = ((psVar9->value).flonum_bits + 8)[(long)psVar11];
        if ((long)cVar2 < 0) {
          dVar12 = -sexp_quarters[(int)cVar2 & 0x7f];
        }
        else {
          dVar12 = sexp_quarters[cVar2];
        }
        break;
      case '\x0f':
        dVar12 = sexp_half_to_double(*(unsigned_short *)
                                      ((long)&psVar9->value + (long)psVar11 * 2 + 8));
        n_00 = extraout_RDX_05;
        psVar8 = psVar6;
      }
      (psVar8->value).flonum = dVar12;
      psVar6 = psVar8;
LAB_0010dda3:
      sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar8,out);
      n_00 = extraout_RDX_10;
switchD_0010dbe2_caseD_3:
      psVar11 = (sexp)((long)&psVar11->tag + 1);
      lVar10 = lVar10 + 0x10;
    } while (psVar3 != psVar11);
  }
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x29,(FILE *)(out->value).type.getters);
  }
  else {
    psVar6 = (out->value).type.print;
    if (psVar6 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar6->tag + 1);
      *(undefined1 *)((long)&psVar6->tag + (long)&psVar3->tag) = 0x29;
    }
    else {
      sexp_buffered_write_char(ctx,0x29,out);
    }
  }
  (ctx->value).context.saves = local_50.next;
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_write_uvector(sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp_uint_t i, len;
  char* str;
  sexp_gc_var2(f, tmp);
  sexp_gc_preserve2(ctx, f, tmp);
  f = sexp_make_flonum(ctx, 0.0f);
  sexp_write_char(ctx, '#', out);
  sexp_write_char(ctx, sexp_uvector_prefix(sexp_uvector_type(obj)), out);
  sexp_write(ctx, sexp_make_fixnum(sexp_uvector_element_size(sexp_uvector_type(obj))), out);
  sexp_write_char(ctx, '(', out);
  len = sexp_uvector_length(obj);
  str = (char*) sexp_uvector_data(obj);
  for (i=0; i<(sexp_sint_t)len; i++) {
    if (i!=0) sexp_write_char(ctx, ' ', out);
    switch (sexp_uvector_type(obj)) {
    case SEXP_U1: sexp_write(ctx, sexp_make_fixnum(sexp_bit_ref(obj, i)), out); break;
    case SEXP_S8: sexp_write(ctx, sexp_make_fixnum(((signed char*)str)[i]), out); break;
    case SEXP_S16: sexp_write(ctx, sexp_make_fixnum(((signed short*)str)[i]), out); break;
    case SEXP_U16: sexp_write(ctx, sexp_make_fixnum(((unsigned short*)str)[i]), out); break;
    case SEXP_S32: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int32_t*)str)[i]), out); break;
    case SEXP_U32: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint32_t*)str)[i]), out); break;
    case SEXP_S64: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int64_t*)str)[i]), out); break;
    case SEXP_U64: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint64_t*)str)[i]), out); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
    case SEXP_F8: sexp_flonum_value_set(f, sexp_quarter_to_double(((unsigned char*)str)[i])); sexp_write(ctx, f, out); break;
    case SEXP_F16: sexp_flonum_value_set(f, sexp_half_to_double(((unsigned short*)str)[i])); sexp_write(ctx, f, out); break;
#endif
    case SEXP_F32: sexp_flonum_value_set(f, ((float*)str)[i]); sexp_write(ctx, f, out); break;
    case SEXP_F64: sexp_flonum_value_set(f, ((double*)str)[i]); sexp_write(ctx, f, out); break;
#endif
#if SEXP_USE_COMPLEX
    case SEXP_C64:
      sexp_flonum_value_set(f, ((float*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((float*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((float*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
    case SEXP_C128:
      sexp_flonum_value_set(f, ((double*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((double*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((double*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
#endif
    }
  }
  sexp_write_char(ctx, ')', out);
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}